

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall
TasGrid::GridGlobal::setSurplusRefinement
          (GridGlobal *this,double tolerance,int output,
          vector<int,_std::allocator<int>_> *level_limits)

{
  bool bVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> *this_00;
  double extraout_XMM0_Qa;
  reference rVar3;
  undefined1 local_c0 [8];
  MultiIndexSet kids;
  int local_88;
  allocator<bool> local_81;
  int i;
  vector<bool,_std::allocator<bool>_> flagged;
  undefined1 local_40 [4];
  int n;
  vector<double,_std::allocator<double>_> surp;
  vector<int,_std::allocator<int>_> *level_limits_local;
  int output_local;
  double tolerance_local;
  GridGlobal *this_local;
  
  surp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)level_limits;
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
  computeSurpluses((vector<double,_std::allocator<double>_> *)local_40,this,output,true);
  iVar2 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  ::std::allocator<bool>::allocator(&local_81);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&i,(long)iVar2,&local_81);
  ::std::allocator<bool>::~allocator(&local_81);
  for (local_88 = 0; local_88 < iVar2; local_88 = local_88 + 1) {
    this_00 = (vector<double,_std::allocator<double>_> *)local_40;
    ::std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_88);
    ::std::abs((int)this_00);
    rVar3 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&i,(long)local_88);
    kids.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)rVar3._M_p;
    ::std::_Bit_reference::operator=
              ((_Bit_reference *)
               &kids.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,tolerance < extraout_XMM0_Qa);
  }
  MultiIndexManipulations::selectFlaggedChildren
            ((MultiIndexSet *)local_c0,&(this->super_BaseCanonicalGrid).points,
             (vector<bool,_std::allocator<bool>_> *)&i,
             (vector<int,_std::allocator<int>_> *)
             surp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  bVar1 = MultiIndexSet::empty((MultiIndexSet *)local_c0);
  if (!bVar1) {
    MultiIndexSet::operator+=((MultiIndexSet *)local_c0,&(this->super_BaseCanonicalGrid).points);
    MultiIndexManipulations::completeSetToLower((MultiIndexSet *)local_c0);
    MultiIndexSet::operator=(&this->updated_tensors,(MultiIndexSet *)local_c0);
    proposeUpdatedTensors(this);
  }
  MultiIndexSet::~MultiIndexSet((MultiIndexSet *)local_c0);
  ::std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return;
}

Assistant:

void GridGlobal::setSurplusRefinement(double tolerance, int output, const std::vector<int> &level_limits){
    clearRefinement();
    std::vector<double> surp = computeSurpluses(output, true);

    int n = points.getNumIndexes();
    std::vector<bool> flagged(n);

    for(int i=0; i<n; i++)
        flagged[i] = (std::abs(surp[i]) > tolerance);

    MultiIndexSet kids = MultiIndexManipulations::selectFlaggedChildren(points, flagged, level_limits);

    if (!kids.empty()){
        kids += points;
        MultiIndexManipulations::completeSetToLower(kids);

        updated_tensors = std::move(kids);
        proposeUpdatedTensors();
    }
}